

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDLevel::CopyEvaluationCacheForExperts
          (ON_SubDLevel *this,ON_SubDHeap *this_heap,ON_SubDLevel *src,ON_SubDHeap *src_heap,
          uint *copy_status)

{
  double dVar1;
  uint level_index;
  uint level_index_00;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ON_SubDVertex *pOVar7;
  ON_SubDVertex *pOVar8;
  ON_SubDEdge *pOVar9;
  ON_SubDEdge *pOVar10;
  ON_SubDFace *pOVar11;
  ON_SubDFace *pOVar12;
  ON_SubDMeshFragment *pOVar13;
  ON_SubDSectorSurfacePoint *pOVar14;
  unsigned_short uVar15;
  ON_SubDHeap *pOVar16;
  ON_SubDFacePtr *pOVar17;
  ON_SubDEdgePtr *pOVar18;
  long lVar19;
  ON_SubDFacePtr *pOVar20;
  ON_SubDEdgePtr *pOVar21;
  ON_SubDSectorSurfacePoint *pOVar22;
  double *pdVar23;
  double *pdVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  byte bVar29;
  double subdivision_point [3];
  ON_SubDVertexIdIterator src_vit;
  ON_SubDVertexIdIterator this_vit;
  ON_SubDEdgeIdIterator this_eit;
  ON_SubDEdgeIdIterator src_eit;
  ON_SubDFaceIdIterator this_fit;
  ON_SubDFaceIdIterator src_fit;
  ON_SimpleArray<ON_3dPoint> edge_curve_cvs;
  ON_SubDSectorSurfacePoint in_stack_fffffffffffffd58;
  ON_3dPoint local_228;
  ON_SubDHeap *local_208;
  ON_SubDHeap *local_200;
  uint local_1f4;
  ON_SubDVertexIdIterator local_1f0;
  ON_SubDVertexIdIterator local_1c8;
  ON_SubDEdgeIdIterator local_1a0;
  ON_SubDEdgeIdIterator local_178;
  ON_SubDFaceIdIterator local_150;
  ON_SubDFaceIdIterator local_128;
  undefined1 local_100 [96];
  double local_a0 [12];
  undefined8 local_40;
  ON_SubDFace *local_38;
  
  bVar29 = 0;
  *copy_status = 0;
  if ((((this == src) || (this->m_vertex_count != src->m_vertex_count)) ||
      (this->m_edge_count != src->m_edge_count)) || (this->m_face_count != src->m_face_count)) {
    ON_SubDIncrementErrorCount();
    return false;
  }
  pOVar16 = src_heap;
  local_1f4 = ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount
                        (4,this->m_face_count);
  level_index = this->m_level_index;
  level_index_00 = src->m_level_index;
  ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&local_1c8.super_ON_FixedSizePoolIterator);
  ON_SubDRef::ON_SubDRef(&local_1c8.m_subd_ref);
  ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&local_1f0.super_ON_FixedSizePoolIterator);
  ON_SubDRef::ON_SubDRef(&local_1f0.m_subd_ref);
  ON_SubDHeap::InitializeVertexIdIterator(this_heap,&local_1c8);
  ON_SubDHeap::InitializeVertexIdIterator(src_heap,&local_1f0);
  local_208 = this_heap;
  pOVar7 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&local_1c8,level_index);
  pOVar8 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&local_1f0,level_index_00);
  local_200 = (ON_SubDHeap *)0x0;
  while ((pOVar7 != (ON_SubDVertex *)0x0 && (pOVar8 != (ON_SubDVertex *)0x0))) {
    if ((((pOVar7->super_ON_SubDComponentBase).m_id != (pOVar8->super_ON_SubDComponentBase).m_id) ||
        ((pOVar7->m_edge_count != pOVar8->m_edge_count ||
         (pOVar7->m_face_count != pOVar8->m_face_count)))) ||
       (pOVar7->m_vertex_tag != pOVar8->m_vertex_tag)) goto LAB_005ed1a5;
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_100,pOVar7->m_P);
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&local_1a0,pOVar8->m_P);
    bVar3 = ON_3dPoint::operator==((ON_3dPoint *)local_100,(ON_3dPoint *)&local_1a0);
    if (!bVar3) goto LAB_005ed1a5;
    if ((((((pOVar7->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) &&
         (ABS((pOVar7->super_ON_SubDComponentBase).m_saved_subd_point1[0]) < 1.23432101234321e+308))
        && (ABS((pOVar7->super_ON_SubDComponentBase).m_saved_subd_point1[1]) < 1.23432101234321e+308
           )) && ((dVar1 = (pOVar7->super_ON_SubDComponentBase).m_saved_subd_point1[2],
                  -1.23432101234321e+308 < dVar1 && (dVar1 < 1.23432101234321e+308)))) {
      ON_SubDVertex::SubdivisionPoint((ON_3dPoint *)local_100,pOVar7);
      ON_SubDVertex::SubdivisionPoint((ON_3dPoint *)&local_1a0,pOVar8);
      bVar3 = ON_3dPoint::operator==((ON_3dPoint *)local_100,(ON_3dPoint *)&local_1a0);
      if (!bVar3) goto LAB_005ed1a5;
    }
    if (((((((pOVar7->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) == 0) ||
          (1.23432101234321e+308 <= ABS((pOVar7->super_ON_SubDComponentBase).m_saved_subd_point1[0])
          )) || ((1.23432101234321e+308 <=
                  ABS((pOVar7->super_ON_SubDComponentBase).m_saved_subd_point1[1]) ||
                 ((1.23432101234321e+308 <=
                   ABS((pOVar7->super_ON_SubDComponentBase).m_saved_subd_point1[2]) ||
                  (bVar3 = ON_SubDVertex::SurfacePointIsSet(pOVar7), !bVar3)))))) &&
        (((pOVar8->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0)) &&
       (((ABS((pOVar8->super_ON_SubDComponentBase).m_saved_subd_point1[0]) < 1.23432101234321e+308
         && (ABS((pOVar8->super_ON_SubDComponentBase).m_saved_subd_point1[1]) <
             1.23432101234321e+308)) &&
        (ABS((pOVar8->super_ON_SubDComponentBase).m_saved_subd_point1[2]) < 1.23432101234321e+308)))
       ) {
      if (pOVar7->m_edge_count != 0) {
        pOVar16 = (ON_SubDHeap *)pOVar7->m_edges;
        lVar19 = 0;
        do {
          iVar25 = 0;
          iVar27 = 0;
          uVar26 = (ulong)(&pOVar16->m_ws)[lVar19] & 0xfffffffffffffff8;
          if (uVar26 != 0) {
            iVar27 = *(int *)(uVar26 + 8);
          }
          uVar26 = pOVar8->m_edges[lVar19].m_ptr;
          uVar28 = uVar26 & 0xfffffffffffffff8;
          if (uVar28 != 0) {
            iVar25 = *(int *)(uVar28 + 8);
          }
          if ((iVar27 != iVar25) || ((((uint)uVar26 ^ (uint)(&pOVar16->m_ws)[lVar19]) & 1) != 0)) {
            ON_SubDIncrementErrorCount();
            goto LAB_005ed1aa;
          }
          lVar19 = lVar19 + 1;
        } while (pOVar7->m_edge_count != (unsigned_short)lVar19);
      }
      local_200 = (ON_SubDHeap *)CONCAT71((int7)((ulong)pOVar16 >> 8),1);
      pOVar16 = local_200;
      if (pOVar7->m_face_count != 0) {
        pOVar16 = (ON_SubDHeap *)pOVar7->m_faces;
        lVar19 = 0;
        do {
          if ((((&pOVar16->m_ws)[lVar19] == (tagWSItem *)0x0) ||
              (pOVar8->m_faces[lVar19] == (ON_SubDFace *)0x0)) ||
             (*(uint *)&(&pOVar16->m_ws)[lVar19]->m_next !=
              (pOVar8->m_faces[lVar19]->super_ON_SubDComponentBase).m_id)) {
            ON_SubDIncrementErrorCount();
            goto LAB_005ed1aa;
          }
          lVar19 = lVar19 + 1;
        } while (pOVar7->m_face_count != (unsigned_short)lVar19);
      }
    }
    pOVar7 = ON_SubDVertexIdIterator::NextVertexOnLevel(&local_1c8,level_index);
    pOVar8 = ON_SubDVertexIdIterator::NextVertexOnLevel(&local_1f0,level_index_00);
  }
  if (pOVar7 != (ON_SubDVertex *)0x0 || pOVar8 != (ON_SubDVertex *)0x0) {
LAB_005ed1a5:
    ON_SubDIncrementErrorCount();
LAB_005ed1aa:
    bVar3 = false;
    goto LAB_005ed1bc;
  }
  ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&local_1a0.super_ON_FixedSizePoolIterator);
  ON_SubDRef::ON_SubDRef(&local_1a0.m_subd_ref);
  ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&local_178.super_ON_FixedSizePoolIterator);
  pOVar16 = local_208;
  ON_SubDRef::ON_SubDRef(&local_178.m_subd_ref);
  ON_SubDHeap::InitializeEdgeIdIterator(pOVar16,&local_1a0);
  ON_SubDHeap::InitializeEdgeIdIterator(src_heap,&local_178);
  pOVar9 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&local_1a0,level_index);
  pOVar10 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&local_178,level_index_00);
  bVar3 = false;
  while ((pOVar9 != (ON_SubDEdge *)0x0 && (pOVar10 != (ON_SubDEdge *)0x0))) {
    if (((pOVar9->super_ON_SubDComponentBase).m_id != (pOVar10->super_ON_SubDComponentBase).m_id) ||
       ((pOVar9->m_face_count != pOVar10->m_face_count ||
        (pOVar9->m_edge_tag != pOVar10->m_edge_tag)))) goto LAB_005ed4e9;
    lVar19 = 0x10;
    do {
      dVar1 = (pOVar9->super_ON_SubDComponentBase).m_saved_subd_point1[lVar19 + -3];
      if (((dVar1 == 0.0) ||
          (dVar2 = (pOVar10->super_ON_SubDComponentBase).m_saved_subd_point1[lVar19 + -3],
          dVar2 == 0.0)) || (*(int *)((long)dVar1 + 8) != *(int *)((long)dVar2 + 8))) {
        ON_SubDIncrementErrorCount();
        goto LAB_005ed4a6;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 == 0x11);
    if (((((pOVar9->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) &&
        (ABS((pOVar9->super_ON_SubDComponentBase).m_saved_subd_point1[0]) < 1.23432101234321e+308))
       && ((ABS((pOVar9->super_ON_SubDComponentBase).m_saved_subd_point1[1]) < 1.23432101234321e+308
           && ((dVar1 = (pOVar9->super_ON_SubDComponentBase).m_saved_subd_point1[2],
               -1.23432101234321e+308 < dVar1 && (dVar1 < 1.23432101234321e+308)))))) {
      ON_SubDEdge::SubdivisionPoint((ON_3dPoint *)local_100,pOVar9);
      ON_SubDEdge::SubdivisionPoint((ON_3dPoint *)&local_150,pOVar10);
      bVar4 = ON_3dPoint::operator==((ON_3dPoint *)local_100,(ON_3dPoint *)&local_150);
      if (!bVar4) goto LAB_005ed4e9;
    }
    if ((((((pOVar10->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) &&
         (ABS((pOVar10->super_ON_SubDComponentBase).m_saved_subd_point1[0]) < 1.23432101234321e+308)
         ) && (ABS((pOVar10->super_ON_SubDComponentBase).m_saved_subd_point1[1]) <
               1.23432101234321e+308)) &&
       (ABS((pOVar10->super_ON_SubDComponentBase).m_saved_subd_point1[2]) < 1.23432101234321e+308))
    {
      bVar3 = true;
      if (pOVar9->m_face_count != 0) {
        pOVar20 = pOVar10->m_face2;
        pOVar17 = pOVar9->m_face2;
        uVar15 = 0;
        do {
          if ((uVar15 == 2) &&
             ((pOVar17 = pOVar9->m_facex, pOVar17 == (ON_SubDFacePtr *)0x0 ||
              (pOVar20 = pOVar10->m_facex, pOVar20 == (ON_SubDFacePtr *)0x0)))) {
LAB_005ed6db:
            ON_SubDIncrementErrorCount();
            goto LAB_005ed4a6;
          }
          uVar26 = pOVar17->m_ptr & 0xfffffffffffffff8;
          if (uVar26 == 0) goto LAB_005ed6db;
          uVar28 = pOVar20->m_ptr & 0xfffffffffffffff8;
          if (((uVar28 == 0) || (*(int *)(uVar26 + 8) != *(int *)(uVar28 + 8))) ||
             ((*(short *)(uVar26 + 0x9c) != *(short *)(uVar28 + 0x9c) ||
              ((((uint)pOVar20->m_ptr ^ (uint)pOVar17->m_ptr) & 1) != 0)))) goto LAB_005ed6db;
          uVar15 = uVar15 + 1;
          pOVar17 = pOVar17 + 1;
          pOVar20 = pOVar20 + 1;
        } while (pOVar9->m_face_count != uVar15);
      }
    }
    pOVar9 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&local_1a0,level_index);
    pOVar10 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&local_178,level_index_00);
  }
  if (pOVar9 == (ON_SubDEdge *)0x0 && pOVar10 == (ON_SubDEdge *)0x0) {
    ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&local_150.super_ON_FixedSizePoolIterator);
    ON_SubDRef::ON_SubDRef(&local_150.m_subd_ref);
    ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&local_128.super_ON_FixedSizePoolIterator);
    ON_SubDRef::ON_SubDRef(&local_128.m_subd_ref);
    ON_SubDHeap::InitializeFaceIdIterator(local_208,&local_150);
    ON_SubDHeap::InitializeFaceIdIterator(src_heap,&local_128);
    pOVar11 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&local_150,level_index);
    pOVar12 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&local_128,level_index_00);
    bVar4 = false;
    while ((pOVar11 != (ON_SubDFace *)0x0 && (pOVar12 != (ON_SubDFace *)0x0))) {
      if (((pOVar11->super_ON_SubDComponentBase).m_id != (pOVar12->super_ON_SubDComponentBase).m_id)
         || (pOVar11->m_edge_count != pOVar12->m_edge_count)) goto LAB_005ed6ea;
      bVar5 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar11->super_ON_SubDComponentBase)
      ;
      if (bVar5) {
        ON_SubDFace::SubdivisionPoint((ON_3dPoint *)local_100,pOVar11);
        ON_SubDFace::SubdivisionPoint(&local_228,pOVar12);
        bVar5 = ON_3dPoint::operator==((ON_3dPoint *)local_100,&local_228);
        if (!bVar5) goto LAB_005ed6ea;
      }
      bVar5 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar11->super_ON_SubDComponentBase)
      ;
      if (((!bVar5) ||
          (pOVar13 = ON_SubDFace::MeshFragments(pOVar11), pOVar13 == (ON_SubDMeshFragment *)0x0)) &&
         (bVar5 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                            (&pOVar12->super_ON_SubDComponentBase), bVar5)) {
        bVar4 = true;
        if (pOVar11->m_edge_count != 0) {
          pOVar21 = pOVar12->m_edge4;
          pOVar18 = pOVar11->m_edge4;
          uVar15 = 0;
          do {
            if ((uVar15 == 4) &&
               ((pOVar18 = pOVar11->m_edgex, pOVar18 == (ON_SubDEdgePtr *)0x0 ||
                (pOVar21 = pOVar12->m_edgex, pOVar21 == (ON_SubDEdgePtr *)0x0)))) {
LAB_005ed6d4:
              ON_SubDIncrementErrorCount();
              goto LAB_005ed6ef;
            }
            iVar25 = 0;
            iVar27 = 0;
            uVar26 = pOVar18->m_ptr & 0xfffffffffffffff8;
            if (uVar26 != 0) {
              iVar27 = *(int *)(uVar26 + 8);
            }
            uVar26 = pOVar21->m_ptr & 0xfffffffffffffff8;
            if (uVar26 != 0) {
              iVar25 = *(int *)(uVar26 + 8);
            }
            if ((iVar27 != iVar25) || ((((uint)pOVar21->m_ptr ^ (uint)pOVar18->m_ptr) & 1) != 0))
            goto LAB_005ed6d4;
            uVar15 = uVar15 + 1;
            pOVar18 = pOVar18 + 1;
            pOVar21 = pOVar21 + 1;
          } while (pOVar11->m_edge_count != uVar15);
        }
      }
      pOVar11 = ON_SubDFaceIdIterator::NextFaceOnLevel(&local_150,level_index);
      pOVar12 = ON_SubDFaceIdIterator::NextFaceOnLevel(&local_128,level_index_00);
    }
    if (pOVar11 == (ON_SubDFace *)0x0 && pOVar12 == (ON_SubDFace *)0x0) {
      if ((((ulong)local_200 & 1) == 0 && !bVar3) && !bVar4) goto LAB_005ed6ef;
      if (((ulong)local_200 & 1) != 0) {
        pOVar7 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&local_1c8,level_index);
        pOVar8 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&local_1f0,level_index_00);
        while ((pOVar7 != (ON_SubDVertex *)0x0 && (pOVar8 != (ON_SubDVertex *)0x0))) {
          if (((pOVar8->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) {
            local_228.x = (pOVar8->super_ON_SubDComponentBase).m_saved_subd_point1[0];
            local_228.y = (pOVar8->super_ON_SubDComponentBase).m_saved_subd_point1[1];
            local_228.z = (pOVar8->super_ON_SubDComponentBase).m_saved_subd_point1[2];
            bVar5 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                              (&pOVar7->super_ON_SubDComponentBase);
            if (!bVar5) {
              ON_SubDComponentBase::SetSavedSubdivisionPoint
                        (&pOVar7->super_ON_SubDComponentBase,&local_228.x);
            }
            bVar5 = ON_SubDVertex::SurfacePointIsSet(pOVar7);
            if (!bVar5) {
              pOVar14 = ON_SubDVertex::SectorSurfacePointForExperts(pOVar8);
              do {
                pOVar22 = pOVar14;
                pdVar23 = (double *)local_100;
                for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
                  *pdVar23 = pOVar22->m_limitP[0];
                  pOVar22 = (ON_SubDSectorSurfacePoint *)((long)pOVar22 + (ulong)bVar29 * -0x10 + 8)
                  ;
                  pdVar23 = pdVar23 + (ulong)bVar29 * -2 + 1;
                }
                if (pOVar14->m_sector_face == (ON_SubDFace *)0x0) {
                  pOVar11 = (ON_SubDFace *)0x0;
                }
                else {
                  uVar6 = ON_SubDVertex::FaceArrayIndex(pOVar8,pOVar14->m_sector_face);
                  if (pOVar8->m_face_count <= uVar6) break;
                  pOVar11 = pOVar7->m_faces[uVar6];
                }
                pdVar23 = (double *)local_100;
                pdVar24 = local_a0;
                for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
                  *pdVar24 = *pdVar23;
                  pdVar23 = pdVar23 + (ulong)bVar29 * -2 + 1;
                  pdVar24 = pdVar24 + (ulong)bVar29 * -2 + 1;
                }
                local_40 = 1;
                local_38 = pOVar11;
                pdVar23 = local_a0;
                pdVar24 = (double *)&stack0xfffffffffffffd58;
                for (lVar19 = 0xe; lVar19 != 0; lVar19 = lVar19 + -1) {
                  *pdVar24 = *pdVar23;
                  pdVar23 = pdVar23 + (ulong)bVar29 * -2 + 1;
                  pdVar24 = pdVar24 + (ulong)bVar29 * -2 + 1;
                }
                ON_SubDVertex::SetSavedSurfacePoint(pOVar7,true,in_stack_fffffffffffffd58);
                pOVar14 = pOVar14->m_next_sector_limit_point;
              } while (pOVar14 != (ON_SubDSectorSurfacePoint *)0x0);
            }
          }
          pOVar7 = ON_SubDVertexIdIterator::NextVertexOnLevel(&local_1c8,level_index);
          pOVar8 = ON_SubDVertexIdIterator::NextVertexOnLevel(&local_1f0,level_index_00);
        }
      }
      if (bVar3) {
        local_100._0_8_ = &PTR__ON_SimpleArray_008179f8;
        local_100._8_8_ = (ON_3dPoint *)0x0;
        local_100._16_8_ = 0.0;
        ON_SimpleArray<ON_3dPoint>::SetCapacity((ON_SimpleArray<ON_3dPoint> *)local_100,0x13);
        pOVar9 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&local_1a0,level_index);
        pOVar10 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&local_178,level_index_00);
        while ((pOVar9 != (ON_SubDEdge *)0x0 && (pOVar10 != (ON_SubDEdge *)0x0))) {
          if (((pOVar10->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) {
            local_228.x = (pOVar10->super_ON_SubDComponentBase).m_saved_subd_point1[0];
            local_228.y = (pOVar10->super_ON_SubDComponentBase).m_saved_subd_point1[1];
            local_228.z = (pOVar10->super_ON_SubDComponentBase).m_saved_subd_point1[2];
            bVar3 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                              (&pOVar9->super_ON_SubDComponentBase);
            if (!bVar3) {
              ON_SubDComponentBase::SetSavedSubdivisionPoint
                        (&pOVar9->super_ON_SubDComponentBase,&local_228.x);
            }
          }
          pOVar9 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&local_1a0,level_index);
          pOVar10 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&local_178,level_index_00);
        }
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)local_100);
      }
      if (bVar4) {
        pOVar11 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&local_150,level_index);
        pOVar12 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&local_128,level_index_00);
        while ((pOVar11 != (ON_SubDFace *)0x0 && (pOVar12 != (ON_SubDFace *)0x0))) {
          if (((pOVar12->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) {
            local_228.x = (pOVar12->super_ON_SubDComponentBase).m_saved_subd_point1[0];
            local_228.y = (pOVar12->super_ON_SubDComponentBase).m_saved_subd_point1[1];
            local_228.z = (pOVar12->super_ON_SubDComponentBase).m_saved_subd_point1[2];
            bVar3 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                              (&pOVar11->super_ON_SubDComponentBase);
            if (!bVar3) {
              ON_SubDComponentBase::SetSavedSubdivisionPoint
                        (&pOVar11->super_ON_SubDComponentBase,&local_228.x);
            }
            pOVar13 = ON_SubDFace::MeshFragments(pOVar11);
            if (((pOVar13 == (ON_SubDMeshFragment *)0x0) &&
                (pOVar13 = ON_SubDFace::MeshFragments(pOVar12),
                pOVar13 != (ON_SubDMeshFragment *)0x0)) &&
               (pOVar13 = ON_SubDHeap::CopyMeshFragments(local_208,pOVar12,local_1f4,pOVar11),
               pOVar13 != (ON_SubDMeshFragment *)0x0)) {
              *(byte *)copy_status = (byte)*copy_status | 1;
              uVar6 = ON_SubDMeshFragment::TextureCoordinateCount(pOVar13);
              if (uVar6 != 0) {
                *(byte *)copy_status = (byte)*copy_status | 2;
              }
              uVar6 = ON_SubDMeshFragment::CurvatureCount(pOVar13);
              if (uVar6 != 0) {
                *(byte *)copy_status = (byte)*copy_status | 4;
              }
              uVar6 = ON_SubDMeshFragment::ColorCount(pOVar13);
              if (uVar6 != 0) {
                *(byte *)copy_status = (byte)*copy_status | 8;
              }
            }
          }
          pOVar11 = ON_SubDFaceIdIterator::NextFaceOnLevel(&local_150,level_index);
          pOVar12 = ON_SubDFaceIdIterator::NextFaceOnLevel(&local_128,level_index_00);
        }
      }
      bVar3 = true;
    }
    else {
LAB_005ed6ea:
      ON_SubDIncrementErrorCount();
LAB_005ed6ef:
      bVar3 = false;
    }
    ON_SubDRef::~ON_SubDRef(&local_128.m_subd_ref);
    ON_SubDRef::~ON_SubDRef(&local_150.m_subd_ref);
  }
  else {
LAB_005ed4e9:
    ON_SubDIncrementErrorCount();
LAB_005ed4a6:
    bVar3 = false;
  }
  ON_SubDRef::~ON_SubDRef(&local_178.m_subd_ref);
  ON_SubDRef::~ON_SubDRef(&local_1a0.m_subd_ref);
LAB_005ed1bc:
  ON_SubDRef::~ON_SubDRef(&local_1f0.m_subd_ref);
  ON_SubDRef::~ON_SubDRef(&local_1c8.m_subd_ref);
  return bVar3;
}

Assistant:

bool ON_SubDLevel::CopyEvaluationCacheForExperts( ON_SubDHeap& this_heap, const ON_SubDLevel& src, const ON_SubDHeap& src_heap, unsigned& copy_status)
{
  copy_status = 0u;
  // Validate conditions for coping the cached evaluation information
  if (
    this == &src
    || m_vertex_count != src.m_vertex_count
    || m_edge_count != src.m_edge_count
    || m_face_count != src.m_face_count
    )
    return ON_SUBD_RETURN_ERROR(false);

  // The built in fragment cache always has adaptive ON_SubDDisplayParameters::DefaultDensity
  unsigned subd_display_density = ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(ON_SubDDisplayParameters::DefaultDensity,m_face_count);
  const unsigned this_level_index = this->m_level_index;
  const unsigned src_level_index = src.m_level_index;

  // It is critical to use the this_vit/src_vit iterators so we got through the vertices in id order.
  // When a copy of an edited subd is made, it is frequently the case that the vertex linked lists
  // are in different order. 
  ON_SubDVertexIdIterator this_vit;
  ON_SubDVertexIdIterator src_vit;
  this_heap.InitializeVertexIdIterator(this_vit);
  src_heap.InitializeVertexIdIterator(src_vit);

  ON_SubDVertex* this_vertex;
  const ON_SubDVertex* src_vertex;
  ON_SubDEdgePtr this_veptr, src_veptr;
  ON_SubDFace* this_face;
  const ON_SubDFace* src_face;
  bool bCopyVertexCache = false;
  for (
    this_vertex = const_cast<ON_SubDVertex*>(this_vit.FirstVertexOnLevel(this_level_index)), src_vertex = src_vit.FirstVertexOnLevel(src_level_index);
    nullptr != this_vertex && nullptr != src_vertex; 
    this_vertex = const_cast<ON_SubDVertex*>(this_vit.NextVertexOnLevel(this_level_index)), src_vertex = src_vit.NextVertexOnLevel(src_level_index)
    )
  {
    if (this_vertex->m_id != src_vertex->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_edge_count != src_vertex->m_edge_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_face_count != src_vertex->m_face_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_vertex_tag != src_vertex->m_vertex_tag)
      return ON_SUBD_RETURN_ERROR(false);
    if (false == (this_vertex->ControlNetPoint() == src_vertex->ControlNetPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->SavedSubdivisionPointIsSet() && false == (this_vertex->SubdivisionPoint() == src_vertex->SubdivisionPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->SavedSubdivisionPointIsSet() && this_vertex->SurfacePointIsSet())
      continue;
    if (false == src_vertex->SavedSubdivisionPointIsSet())
      continue;
    bCopyVertexCache = true;
    for (unsigned short vei = 0; vei < this_vertex->m_edge_count; ++vei)
    {
      this_veptr = this_vertex->m_edges[vei];
      src_veptr = src_vertex->m_edges[vei];
      if ( this_veptr.EdgeId() != src_veptr.EdgeId())
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_SUBD_EDGE_DIRECTION(this_veptr.m_ptr) != ON_SUBD_EDGE_DIRECTION(src_veptr.m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
    for (unsigned short vfi = 0; vfi < this_vertex->m_face_count; ++vfi)
    {
      this_face = const_cast<ON_SubDFace*>(this_vertex->m_faces[vfi]);
      src_face = src_vertex->m_faces[vfi];
      if (nullptr == this_face || nullptr == src_face || this_face->m_id != src_face->m_id)
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_vertex || nullptr != src_vertex)
    return ON_SUBD_RETURN_ERROR(false);

  // It is critical to use the this_eit/src_eit iterators so we got through the edges in id order.
  // When a copy of an edited subd is made, it is frequently the case that the edge linked lists
  // are in different order. 
  ON_SubDEdgeIdIterator this_eit;
  ON_SubDEdgeIdIterator src_eit;
  this_heap.InitializeEdgeIdIterator(this_eit);
  src_heap.InitializeEdgeIdIterator(src_eit);

  ON_SubDEdge* this_edge;
  const ON_SubDEdge* src_edge;
  const ON_SubDFacePtr* this_fptr;
  const ON_SubDFacePtr* src_fptr;
  bool bCopyEdgeCache = false;
  for (
    this_edge = const_cast<ON_SubDEdge*>(this_eit.FirstEdgeOnLevel(this_level_index)), src_edge = src_eit.FirstEdgeOnLevel(src_level_index);
    nullptr != this_edge && nullptr != src_edge;
    this_edge = const_cast<ON_SubDEdge*>(this_eit.NextEdgeOnLevel(this_level_index)), src_edge = src_eit.NextEdgeOnLevel(src_level_index)
    )
  {
    if (this_edge->m_id != src_edge->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->m_face_count != src_edge->m_face_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->m_edge_tag != src_edge->m_edge_tag)
      return ON_SUBD_RETURN_ERROR(false);
    for (int evi = 0; evi < 2; ++evi)
    {
      if (nullptr == this_edge->m_vertex[evi] || nullptr == src_edge->m_vertex[evi])
        return ON_SUBD_RETURN_ERROR(false);
      if (this_edge->m_vertex[evi]->m_id != src_edge->m_vertex[evi]->m_id)
        return ON_SUBD_RETURN_ERROR(false);
    }
    if (this_edge->SavedSubdivisionPointIsSet() && false == (this_edge->SubdivisionPoint() == src_edge->SubdivisionPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->SavedSubdivisionPointIsSet() && this_edge->EdgeSurfaceCurveIsSet())
      continue;
    if (false == src_edge->SavedSubdivisionPointIsSet())
      continue;
    bCopyEdgeCache = true;
    this_fptr = this_edge->m_face2;
    src_fptr = src_edge->m_face2;
    for (unsigned short efi = 0; efi < this_edge->m_face_count; ++efi, ++this_fptr, ++src_fptr)
    {
      if (2 == efi)
      {
        this_fptr = this_edge->m_facex;
        src_fptr = src_edge->m_facex;
        if (nullptr == this_fptr || nullptr == src_fptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      this_face = ON_SUBD_FACE_POINTER(this_fptr->m_ptr);
      src_face = ON_SUBD_FACE_POINTER(src_fptr->m_ptr);
      if (nullptr == this_face || nullptr == src_face || this_face->m_id != src_face->m_id )
        return ON_SUBD_RETURN_ERROR(false);
      if ( this_face->m_edge_count != src_face->m_edge_count )
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_SUBD_FACE_DIRECTION(this_fptr->m_ptr) != ON_SUBD_FACE_DIRECTION(src_fptr->m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_edge || nullptr != src_edge)
    return ON_SUBD_RETURN_ERROR(false);

  // It is critical to use the this_fit/src_fit iterators so we got through the faces in id order.
  // When a copy of an edited subd is made, it is frequently the case that the face linked lists
  // are in different order. 
  ON_SubDFaceIdIterator this_fit;
  ON_SubDFaceIdIterator src_fit;
  this_heap.InitializeFaceIdIterator(this_fit);
  src_heap.InitializeFaceIdIterator(src_fit);

  const ON_SubDEdgePtr* this_eptr;
  const ON_SubDEdgePtr* src_eptr;
  bool bCopyFaceCache = false;
  for (
    this_face = const_cast<ON_SubDFace*>(this_fit.FirstFaceOnLevel(this_level_index)), src_face = src_fit.FirstFaceOnLevel(src_level_index);
    nullptr != this_face && nullptr != src_face;
    this_face = const_cast<ON_SubDFace*>(this_fit.NextFaceOnLevel(this_level_index)), src_face = src_fit.NextFaceOnLevel(src_level_index)
    )
  {
    if (this_face->m_id != src_face->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->m_edge_count != src_face->m_edge_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->SavedSubdivisionPointIsSet() && false == (this_face->SubdivisionPoint() == src_face->SubdivisionPoint()) )
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->SavedSubdivisionPointIsSet() && nullptr != this_face->MeshFragments())
      continue;
    if (false == src_face->SavedSubdivisionPointIsSet())
      continue;
    bCopyFaceCache = true;
    this_eptr = this_face->m_edge4;
    src_eptr = src_face->m_edge4;
    for (unsigned short fei = 0; fei < this_face->m_edge_count; ++fei, ++this_eptr, ++src_eptr)
    {
      if (4 == fei)
      {
        this_eptr = this_face->m_edgex;
        src_eptr = src_face->m_edgex;
        if(nullptr == this_eptr || nullptr == src_eptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      if ( this_eptr->EdgeId() != src_eptr->EdgeId())
        return ON_SUBD_RETURN_ERROR(false);
      if ( ON_SUBD_EDGE_DIRECTION(this_eptr->m_ptr) != ON_SUBD_EDGE_DIRECTION(src_eptr->m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_face || nullptr != src_face)
    return ON_SUBD_RETURN_ERROR(false);

  if (false == bCopyVertexCache && false == bCopyEdgeCache && false == bCopyFaceCache)
    return false;

  // this and src subd have identical geometry - copy evaluation cache

  double subdivision_point[3];
  if (bCopyVertexCache)
  {
    // It is critical to use the this_vit/src_vit iterators so we got through the vertices in id order.
    // When a copy of an edited subd is made, it is frequently the case that the vertex linked lists
    // are in different order. 
    ON_SubDSectorSurfacePoint this_limit_point;
    for (
      this_vertex = const_cast<ON_SubDVertex*>(this_vit.FirstVertexOnLevel(this_level_index)), src_vertex = src_vit.FirstVertexOnLevel(src_level_index);
      nullptr != this_vertex && nullptr != src_vertex;
      this_vertex = const_cast<ON_SubDVertex*>(this_vit.NextVertexOnLevel(this_level_index)), src_vertex = src_vit.NextVertexOnLevel(src_level_index)
      )
    {
      if (false == src_vertex->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if (false == this_vertex->SavedSubdivisionPointIsSet())
        this_vertex->SetSavedSubdivisionPoint(subdivision_point);
     
      if (false == this_vertex->SurfacePointIsSet())
      {
        for (const ON_SubDSectorSurfacePoint* src_limit_point = &src_vertex->SectorSurfacePointForExperts(); nullptr != src_limit_point; src_limit_point = src_limit_point->m_next_sector_limit_point)
        {
          this_limit_point = *src_limit_point;
          this_limit_point.m_next_sector_limit_point = (ON_SubDSectorSurfacePoint*)1;
          this_limit_point.m_sector_face = nullptr;
          if (nullptr != src_limit_point->m_sector_face)
          {
            const unsigned vfi = src_vertex->FaceArrayIndex(src_limit_point->m_sector_face);
            if (vfi >= src_vertex->m_face_count)
              break;
            this_limit_point.m_sector_face = this_vertex->m_faces[vfi];
          }
          this_vertex->SetSavedSurfacePoint(true, this_limit_point);
        }
      }
    }
  }

  if (bCopyEdgeCache)
  {    
    // It is critical to use the this_eit/src_eit iterators so we got through the edges in id order.
    // When a copy of an edited subd is made, it is frequently the case that the edge linked lists
    // are in different order. 
    ON_SimpleArray<ON_3dPoint> edge_curve_cvs(ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity);
    for (
      this_edge = const_cast<ON_SubDEdge*>(this_eit.FirstEdgeOnLevel(this_level_index)), src_edge = src_eit.FirstEdgeOnLevel(src_level_index);
      nullptr != this_edge && nullptr != src_edge;
      this_edge = const_cast<ON_SubDEdge*>(this_eit.NextEdgeOnLevel(this_level_index)), src_edge = src_eit.NextEdgeOnLevel(src_level_index)
      )
    {
      if (false == src_edge->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if (false == this_edge->SavedSubdivisionPointIsSet())
        this_edge->SetSavedSubdivisionPoint(subdivision_point);
      if ( false == this_edge->EdgeSurfaceCurveIsSet() && src_edge->EdgeSurfaceCurveIsSet( ))
        this_heap.CopyEdgeSurfaceCurve(src_edge, this_edge);
    }
  }

  if (bCopyFaceCache)
  {
    // It is critical to use the this_fit/src_fit iterators so we got through the faces in id order.
    // When a copy of an edited subd is made, it is frequently the case that the face linked lists
    // are in different order. 
    for (
      this_face = const_cast<ON_SubDFace*>(this_fit.FirstFaceOnLevel(this_level_index)), src_face = src_fit.FirstFaceOnLevel(src_level_index);
      nullptr != this_face && nullptr != src_face;
      this_face = const_cast<ON_SubDFace*>(this_fit.NextFaceOnLevel(this_level_index)), src_face = src_fit.NextFaceOnLevel(src_level_index)
      )
    {
      if (false == src_face->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if ( false == this_face->SavedSubdivisionPointIsSet())
        this_face->SetSavedSubdivisionPoint(subdivision_point);
      if (nullptr == this_face->MeshFragments() && nullptr != src_face->MeshFragments())
      {
        const ON_SubDMeshFragment* this_frag = this_heap.CopyMeshFragments(src_face, subd_display_density, this_face);
        if (nullptr != this_frag)
        {
          copy_status |= 1u;
          if (this_frag->TextureCoordinateCount() > 0)
            copy_status |= 2u;
          if (this_frag->CurvatureCount() > 0)
            copy_status |= 4u;
          if (this_frag->ColorCount() > 0)
            copy_status |= 8u;
        }
      }
    }
  }

  return true;
}